

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O1

Vector2i sf::priv::InputImpl::getMousePosition(void)

{
  Display *display;
  Vector2i VVar1;
  int gy;
  int gx;
  uint buttons;
  int y;
  int x;
  Window child;
  Window root;
  
  display = OpenDisplay();
  gx = 0;
  gy = 0;
  XQueryPointer(display,*(undefined8 *)
                         (*(long *)(display + 0xe8) + 0x10 + (long)*(int *)(display + 0xe0) * 0x80),
                &root,&child,&gx,&gy,&x,&y,&buttons);
  CloseDisplay(display);
  VVar1.y = gy;
  VVar1.x = gx;
  return VVar1;
}

Assistant:

Vector2i InputImpl::getMousePosition()
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    // we don't care about these but they are required
    ::Window root, child;
    int x, y;
    unsigned int buttons;

    int gx = 0;
    int gy = 0;
    XQueryPointer(display, DefaultRootWindow(display), &root, &child, &gx, &gy, &x, &y, &buttons);

    // Close the connection with the X server
    CloseDisplay(display);

    return Vector2i(gx, gy);
}